

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O3

bitwidth_t __thiscall slang::SVInt::getMinRepresentedBits(SVInt *this)

{
  logic_t lVar1;
  bitwidth_t bVar2;
  bitwidth_t bVar3;
  
  if ((this->super_SVIntStorage).signFlag != false) {
    lVar1 = operator[](this,(this->super_SVIntStorage).bitWidth - 1);
    if (((lVar1.value == '\0') || (lVar1.value == 0x80)) || (lVar1.value == '@')) {
      bVar3 = getActiveBits(this);
    }
    else {
      bVar3 = (this->super_SVIntStorage).bitWidth;
      bVar2 = countLeadingOnes(this);
      bVar3 = bVar3 - bVar2;
    }
    return bVar3 + 1;
  }
  bVar3 = getActiveBits(this);
  return bVar3;
}

Assistant:

bitwidth_t getMinRepresentedBits() const {
        if (!signFlag)
            return getActiveBits();
        else if (isNegative())
            return bitWidth - countLeadingOnes() + 1;
        else
            return getActiveBits() + 1;
    }